

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluxTrackBuilder.cpp
# Opt level: O2

void __thiscall FluxTrackBuilder::addRawBit(FluxTrackBuilder *this,bool next_bit)

{
  int iVar1;
  int iVar2;
  uint32_t uVar3;
  uint local_24;
  
  this->m_flux_time = this->m_flux_time + this->m_bitcell_ns;
  if (this->m_curr_bit == true) {
    if (*(int *)&(this->super_TrackBuilder).field_0x14 < 0x28) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->m_flux_times,&this->m_flux_time);
      uVar3 = 0;
    }
    else {
      iVar1 = -0xf0;
      if (this->m_last_bit != false) {
        iVar1 = 0xf0;
      }
      iVar2 = 0;
      if (this->m_last_bit != next_bit) {
        iVar2 = iVar1;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&this->m_flux_times,&local_24);
      uVar3 = -iVar2;
    }
    this->m_flux_time = uVar3;
  }
  this->m_last_bit = this->m_curr_bit;
  this->m_curr_bit = next_bit;
  return;
}

Assistant:

void FluxTrackBuilder::addRawBit(bool next_bit)
{
    m_flux_time += m_bitcell_ns;

    if (m_curr_bit)
    {
        if (m_cylhead.cyl < 40)
        {
            m_flux_times.push_back(m_flux_time);
            m_flux_time = 0;
        }
        else
        {
            // Move adjacent transitions further apart, to account for attraction when written.
            auto pre_comp_ns{ (m_last_bit == next_bit) ? 0 : (m_last_bit ? +PRECOMP_NS : -PRECOMP_NS) };

            m_flux_times.push_back(m_flux_time + pre_comp_ns);
            m_flux_time = 0 - pre_comp_ns;
        }
    }

    m_last_bit = m_curr_bit;
    m_curr_bit = next_bit;
}